

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::
ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler>::VarHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,TestNLHandler> *this
          )

{
  int iVar1;
  int iVar2;
  double value;
  VarHandler vh;
  ItemHandler<(mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::ItemType)0>
  local_28;
  
  iVar1 = BinaryReader<mp::internal::IdentityConverter>::ReadUInt
                    (*(BinaryReader<mp::internal::IdentityConverter> **)this);
  local_28.reader_ =
       (NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler> *)this;
  if (**(int **)(this + 8) < iVar1) {
    BinaryReaderBase::ReportError<>(*(BinaryReaderBase **)this,(CStringRef)0x2178ae);
  }
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (iVar2 != 0) {
    iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::
            ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>
                      *)this,((local_28.reader_)->header_->super_NLProblemInfo).
                             super_NLProblemInfo_C.num_vars);
    value = BinaryReader<mp::internal::IdentityConverter>::ReadDouble
                      (*(BinaryReader<mp::internal::IdentityConverter> **)this);
    NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_TestNLHandler>::VarHandler
    ::SetInitialValue((VarHandler *)&local_28,iVar1,value);
    iVar2 = iVar2 + -1;
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}